

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O0

int __thiscall
QGridLayoutPrivate::heightForWidth(QGridLayoutPrivate *this,int w,int hSpacing,int vSpacing)

{
  int in_ESI;
  QGridLayoutPrivate *in_RDI;
  long in_FS_OFFSET;
  int hMargins;
  int bottom;
  int right;
  int top;
  int left;
  int in_stack_000000d8;
  int in_stack_000000dc;
  undefined4 in_stack_000000e0;
  int in_stack_000000e4;
  int in_stack_000000e8;
  int in_stack_000000ec;
  int in_stack_000000f0;
  int in_stack_000000f4;
  QList<QLayoutStruct> *in_stack_000000f8;
  QGridLayoutPrivate *pQVar1;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar2;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = in_RDI;
  setupLayoutData((QGridLayoutPrivate *)CONCAT44(in_stack_000000e4,in_stack_000000e0),
                  in_stack_000000dc,in_stack_000000d8);
  iVar2 = (int)((ulong)pQVar1 >> 0x20);
  if (((byte)in_RDI->field_0x194 >> 3 & 1) == 0) {
    iVar2 = -1;
  }
  else {
    local_c = -0x55555556;
    local_10 = -0x55555556;
    local_14 = -0x55555556;
    local_18 = -0x55555556;
    effectiveMargins(in_RDI,&local_c,&local_10,&local_14,&local_18);
    if (in_ESI - (local_c + local_14) != in_RDI->hfw_width) {
      qGeomCalc(in_stack_000000f8,in_stack_000000f4,in_stack_000000f0,in_stack_000000ec,
                in_stack_000000e8,in_stack_000000e4);
      recalcHFW((QGridLayoutPrivate *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                iVar2);
    }
    iVar2 = in_RDI->hfw_height + local_10 + local_18;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QGridLayoutPrivate::heightForWidth(int w, int hSpacing, int vSpacing)
{
    setupLayoutData(hSpacing, vSpacing);
    if (!has_hfw)
        return -1;
    int left, top, right, bottom;
    effectiveMargins(&left, &top, &right, &bottom);

    int hMargins = left + right;
    if (w - hMargins != hfw_width) {
        qGeomCalc(colData, 0, cc, 0, w - hMargins);
        recalcHFW(w - hMargins);
    }
    return hfw_height + top + bottom;
}